

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

TCGLabel * gen_hook_sys(DisasContext_conflict1 *s,uint32_t insn,hook *hk)

{
  TCGContext_conflict1 *s_00;
  TCGLabel *l;
  TCGv_i32 retval;
  TCGv_i32 arg2;
  TCGv_i64 arg3;
  TCGv_ptr tcg_hk;
  TCGv_i32 tcg_insn;
  TCGv_i32 tcg_skip;
  TCGLabel *label;
  TCGContext_conflict1 *tcg_ctx;
  uc_struct *uc;
  hook *hk_local;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  s_00 = s->uc->tcg_ctx;
  l = gen_new_label_aarch64(s_00);
  retval = tcg_temp_new_i32(s_00);
  arg2 = tcg_const_i32_aarch64(s_00,insn);
  arg3 = tcg_const_i64_aarch64(s_00,(int64_t)hk);
  gen_a64_set_pc_im_aarch64(s_00,s->pc_curr);
  gen_helper_uc_hooksys64(s_00,retval,s_00->cpu_env,arg2,(TCGv_ptr)arg3);
  tcg_gen_brcondi_i32_aarch64(s_00,TCG_COND_NE,retval,0,l);
  tcg_temp_free_i32(s_00,retval);
  tcg_temp_free_i32(s_00,arg2);
  tcg_temp_free_ptr(s_00,(TCGv_ptr)arg3);
  return l;
}

Assistant:

static TCGLabel *gen_hook_sys(DisasContext *s, uint32_t insn, struct hook *hk)
{
    uc_engine *uc = s->uc;
    TCGContext *tcg_ctx = uc->tcg_ctx;
    TCGLabel *label = gen_new_label(tcg_ctx);
    TCGv_i32 tcg_skip, tcg_insn;
    TCGv_ptr tcg_hk;

    tcg_skip = tcg_temp_new_i32(tcg_ctx);
    tcg_insn = tcg_const_i32(tcg_ctx, insn);
    tcg_hk = tcg_const_ptr(tcg_ctx, (void*)hk);

    // Sync pc in advance.
    gen_a64_set_pc_im(tcg_ctx, s->pc_curr);

    // Only one hook per instruction for SYS/SYSL/MRS/MSR is allowed.
    // This is intended and may be extended if it's really necessary.
    gen_helper_uc_hooksys64(tcg_ctx, tcg_skip, tcg_ctx->cpu_env, tcg_insn, tcg_hk);

    tcg_gen_brcondi_i32(tcg_ctx, TCG_COND_NE, tcg_skip, 0, label);
    
    tcg_temp_free_i32(tcg_ctx, tcg_skip);
    tcg_temp_free_i32(tcg_ctx, tcg_insn);
    tcg_temp_free_ptr(tcg_ctx, tcg_hk);

    return label;
}